

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O1

wchar_t my_stricmp(char *s1,char *s2)

{
  byte bVar1;
  wchar_t wVar2;
  __int32_t **pp_Var3;
  long lVar4;
  
  for (lVar4 = 0; (bVar1 = s1[lVar4], (ulong)bVar1 != 0 || (s2[lVar4] != '\0')); lVar4 = lVar4 + 1)
  {
    pp_Var3 = __ctype_toupper_loc();
    wVar2 = (int)(char)(*pp_Var3)[bVar1] - (int)(char)(*pp_Var3)[(byte)s2[lVar4]];
    if (wVar2 != L'\0') {
      return wVar2;
    }
  }
  return L'\0';
}

Assistant:

int my_stricmp(const char *s1, const char *s2)
{
	char ch1 = 0;
	char ch2 = 0;

	/* Just loop */
	while (true) {
		/* We've reached the end of both strings simultaneously */
		if ((*s1 == 0) && (*s2 == 0)) {
			/* We're still here, so s1 and s2 are equal */
			return (0);
		}

		ch1 = toupper((unsigned char) *s1);
		ch2 = toupper((unsigned char) *s2);

		/* If the characters don't match */
		if (ch1 != ch2) {
			/* return the difference between them */
			return ((int)(ch1 - ch2));
		}

		/* Step on through both strings */
		s1++;
		s2++;
	}
}